

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O1

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
       *this)

{
  iterator __position;
  IEnumerable<int> *pIVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  vector<int,std::allocator<int>> *this_00;
  undefined8 uVar5;
  iterator __begin0;
  iterator __end0;
  key_type_conflict local_10d;
  int local_10c;
  iterator local_108;
  iterator local_c0;
  iterator local_78;
  
  (**((this->source).source.source1.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IState)();
  (**((this->source).source.source2.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IState)();
  iVar4 = (*((this->source).source.source1.state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IState
            [1])();
  (this->source).source.s1 = SUB41(iVar4,0);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->result)._M_t);
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::begin
            (&local_108,&this->source);
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::end
            (&local_78,&this->source);
  uVar2 = local_108.valid;
  while( true ) {
    local_108.valid = (bool)uVar2;
    local_c0.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00158168;
    local_c0.source.s1 = local_78.source.s1;
    local_c0.source.source1.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
    local_c0.source.source1.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_78.source.source1.state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c0.source.source1.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_78.source.source1.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_78.source.source1.state.
        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.source.source1.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.source.source1.state.
                        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.source.source1.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.source.source1.state.
                        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_c0.source.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
    local_c0.source.source2.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_78.source.source2.state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c0.source.source2.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_78.source.source2.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_78.source.source2.state.
        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.source.source2.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.source.source2.state.
                        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.source.source2.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.source.source2.state.
                        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_c0.valid = local_78.valid;
    bVar3 = IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
            ::iterator::operator!=(&local_108,&local_c0);
    local_c0.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00158168;
    local_c0.source.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
    if (local_c0.source.source2.state.
        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.source.source2.state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    local_c0.source.source1.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
    if (local_c0.source.source1.state.
        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.source.source1.state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if (!bVar3) break;
    pIVar1 = &local_108.source.source2;
    if (local_108.source.s1 != false) {
      pIVar1 = &local_108.source.source1;
    }
    local_10c = (*((pIVar1->state).super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_IState[3])();
    if ((this->transformer).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar5 = std::__throw_bad_function_call();
      IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
      iterator::~iterator(&local_108);
      _Unwind_Resume(uVar5);
    }
    local_10d = (*(this->transformer)._M_invoker)((_Any_data *)&this->transformer,&local_10c);
    this_00 = (vector<int,std::allocator<int>> *)
              std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_10d);
    __position._M_current = *(int **)(this_00 + 8);
    if (__position._M_current == *(int **)(this_00 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (this_00,__position,&local_10c);
    }
    else {
      *__position._M_current = local_10c;
      *(int **)(this_00 + 8) = __position._M_current + 1;
    }
    if (local_108.source.s1 == true) {
      (*(local_108.source.source1.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IState[2])
                ();
      iVar4 = (*(local_108.source.source1.state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_IState[1])();
      if ((char)iVar4 == '\0') {
        local_108.source.s1 = false;
      }
    }
    else {
      (*(local_108.source.source2.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IState[2])
                ();
    }
    uVar2 = true;
    if (local_108.source.s1 == false) {
      iVar4 = (*(local_108.source.source2.state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_IState[1])();
      uVar2 = (char)iVar4;
    }
  }
  local_78.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00158168;
  local_78.source.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_78.source.source2.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.source.source2.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_78.source.source1.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_78.source.source1.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.source.source1.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_108.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00158168;
  local_108.source.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_108.source.source2.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.source.source2.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_108.source.source1.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_108.source.source1.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.source.source1.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (this->current)._M_node = (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}